

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::
ApplyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::ApplyVar(ApplyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           *this,ApplyFunc *func,VariableP<tcu::Matrix<float,_3,_4>_> *arg0,
          VariableP<tcu::Matrix<float,_3,_4>_> *arg1,VariableP<vkt::shaderexecutor::Void> *arg2,
          VariableP<vkt::shaderexecutor::Void> *arg3)

{
  SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> SStack_68;
  SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> local_58;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_4>_>_> local_48;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_4>_>_> local_38;
  
  VariableP::operator_cast_to_ExprP((VariableP *)&local_38);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_48);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_58);
  VariableP::operator_cast_to_ExprP((VariableP *)&SStack_68);
  Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::Apply(&this->
           super_Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          ,func,(ExprP<tcu::Matrix<float,_3,_4>_> *)&local_38,
          (ExprP<tcu::Matrix<float,_3,_4>_> *)&local_48,
          (ExprP<vkt::shaderexecutor::Void> *)&local_58,
          (ExprP<vkt::shaderexecutor::Void> *)&SStack_68);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::release(&SStack_68);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::release(&local_58);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_4>_>_>::release(&local_48);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_4>_>_>::release(&local_38);
  (this->
  super_Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_tcu::Matrix<float,_3,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ).super_Expr<tcu::Matrix<float,_3,_4>_>.super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Apply_00be9ba0;
  return;
}

Assistant:

ApplyVar	(const ApplyFunc&			func,
									 const VariableP<Arg0>&		arg0,
									 const VariableP<Arg1>&		arg1,
									 const VariableP<Arg2>&		arg2,
									 const VariableP<Arg3>&		arg3)
							: Apply<Sig> (func, arg0, arg1, arg2, arg3) {}